

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::PrintCommandTrace(cmMakefile *this,cmListFileFunction *lff)

{
  bool bVar1;
  cmake *pcVar2;
  pointer pbVar3;
  pointer pcVar4;
  __type _Var5;
  long lVar6;
  ostream *poVar7;
  pointer pcVar8;
  const_iterator __begin2;
  pointer filename;
  pointer pcVar9;
  string local_228;
  string local_208;
  string temp;
  string local_1c8;
  ostringstream msg;
  
  pcVar2 = this->GlobalGenerator->CMakeInstance;
  GetExecutionFilePath_abi_cxx11_(&local_228,this);
  cmsys::SystemTools::GetFilenameName(&local_1c8,&local_228);
  filename = (pcVar2->TraceOnlyThisSources).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (pcVar2->TraceOnlyThisSources).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (filename == pbVar3) {
LAB_00273f80:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar7 = std::operator<<((ostream *)&msg,(string *)&local_228);
    poVar7 = std::operator<<(poVar7,"(");
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    std::operator<<(poVar7,"):  ");
    poVar7 = std::operator<<((ostream *)&msg,(string *)&(lff->super_cmCommandContext).Name.Original)
    ;
    std::operator<<(poVar7,"(");
    bVar1 = this->GlobalGenerator->CMakeInstance->TraceExpand;
    temp._M_dataplus._M_p = (pointer)&temp.field_2;
    temp._M_string_length = 0;
    temp.field_2._M_local_buf[0] = '\0';
    pcVar4 = (lff->Arguments).
             super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pcVar9 = (lff->Arguments).
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_start; pcVar9 != pcVar4; pcVar9 = pcVar9 + 1) {
      pcVar8 = pcVar9;
      if (bVar1 != false) {
        std::__cxx11::string::_M_assign((string *)&temp);
        ExpandVariablesInString(this,&temp);
        pcVar8 = (pointer)&temp;
      }
      std::operator<<((ostream *)&msg,(string *)pcVar8);
      std::operator<<((ostream *)&msg," ");
    }
    std::operator<<((ostream *)&msg,")");
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message(&local_208,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&temp);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  else {
    for (; filename != pbVar3; filename = filename + 1) {
      lVar6 = std::__cxx11::string::rfind((string *)&local_228,(ulong)filename);
      if ((lVar6 != -1) && (lVar6 + filename->_M_string_length == local_228._M_string_length)) {
        cmsys::SystemTools::GetFilenameName((string *)&msg,filename);
        _Var5 = std::operator==(&local_1c8,(string *)&msg);
        std::__cxx11::string::~string((string *)&msg);
        if (_Var5) goto LAB_00273f80;
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_228);
  return;
}

Assistant:

void cmMakefile::PrintCommandTrace(const cmListFileFunction& lff) const
{
  // Check if current file in the list of requested to trace...
  std::vector<std::string> const& trace_only_this_files =
    this->GetCMakeInstance()->GetTraceSources();
  std::string const& full_path = this->GetExecutionFilePath();
  std::string const& only_filename = cmSystemTools::GetFilenameName(full_path);
  bool trace = trace_only_this_files.empty();
  if (!trace) {
    for (std::string const& file : trace_only_this_files) {
      std::string::size_type const pos = full_path.rfind(file);
      trace = (pos != std::string::npos) &&
        ((pos + file.size()) == full_path.size()) &&
        (only_filename == cmSystemTools::GetFilenameName(file));
      if (trace) {
        break;
      }
    }
    // Do nothing if current file wasn't requested for trace...
    if (!trace) {
      return;
    }
  }

  std::ostringstream msg;
  msg << full_path << "(" << lff.Line << "):  ";
  msg << lff.Name.Original << "(";
  bool expand = this->GetCMakeInstance()->GetTraceExpand();
  std::string temp;
  for (cmListFileArgument const& arg : lff.Arguments) {
    if (expand) {
      temp = arg.Value;
      this->ExpandVariablesInString(temp);
      msg << temp;
    } else {
      msg << arg.Value;
    }
    msg << " ";
  }
  msg << ")";
  cmSystemTools::Message(msg.str());
}